

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O1

void EPSG_reset(EPSG *psg)

{
  long lVar1;
  
  psg->base_count = 0;
  lVar1 = 0x5b;
  do {
    *(undefined2 *)((long)psg + lVar1 * 2 + -0x76) = 0x1000;
    (psg->reg + lVar1 * 2 + -0x7c)[0] = '\0';
    (psg->reg + lVar1 * 2 + -0x7c)[1] = '\0';
    psg->reg[lVar1 + -0x1b] = '\0';
    psg->reg[lVar1 + -0x25] = '\0';
    (psg->reg + lVar1 * 2 + -0x10)[0] = '\0';
    (psg->reg + lVar1 * 2 + -0x10)[1] = '\0';
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x5e);
  psg->reg[0] = '\0';
  psg->reg[1] = '\0';
  psg->reg[2] = '\0';
  psg->reg[3] = '\0';
  psg->reg[4] = '\0';
  psg->reg[5] = '\0';
  psg->reg[6] = '\0';
  psg->reg[7] = '\0';
  psg->reg[8] = '\0';
  psg->reg[9] = '\0';
  psg->reg[10] = '\0';
  psg->reg[0xb] = '\0';
  psg->reg[0xc] = '\0';
  psg->reg[0xd] = '\0';
  psg->reg[0xe] = '\0';
  psg->reg[0xf] = '\0';
  psg->adr = '\0';
  psg->noise_seed = 0xffff;
  psg->noise_count = '@';
  psg->noise_freq = '\0';
  psg->env_ptr = '\0';
  psg->env_freq = 0;
  psg->env_count = 0;
  psg->env_pause = '\x01';
  return;
}

Assistant:

void
EPSG_reset (EPSG * psg)
{
  int i;

  psg->base_count = 0;

  for (i = 0; i < 3; i++)
  {
    psg->count[i] = 0x1000;
    psg->freq[i] = 0;
    psg->edge[i] = 0;
    psg->volume[i] = 0;
    psg->ch_out[i] = 0;
  }

  //psg->mask = 0;

  for (i = 0; i < 16; i++)
    psg->reg[i] = 0;
  psg->adr = 0;

  psg->noise_seed = 0xffff;
  psg->noise_count = 0x40;
  psg->noise_freq = 0;

  //psg->env_volume = 0;
  psg->env_ptr = 0;
  psg->env_freq = 0;
  psg->env_count = 0;
  psg->env_pause = 1;

  //psg->out = 0;

}